

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_mul(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                   _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi *X_00;
  mbedtls_mpi_uint *pmVar1;
  uchar swap;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mbedtls_ecp_point RP;
  mbedtls_mpi E;
  mbedtls_mpi B;
  mbedtls_mpi D;
  mbedtls_mpi BB;
  mbedtls_mpi DA;
  mbedtls_mpi C;
  mbedtls_mpi AA;
  mbedtls_mpi A;
  mbedtls_mpi PX;
  mbedtls_ecp_point local_178;
  mbedtls_mpi local_130;
  mbedtls_mpi local_118;
  mbedtls_mpi local_100;
  mbedtls_mpi local_e8;
  mbedtls_mpi *local_d0;
  size_t local_c8;
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar2 = mbedtls_mpi_cmp_int(&P->Z,1);
  iVar3 = -0x4f80;
  if (((iVar2 == 0) && (iVar3 = mbedtls_ecp_check_privkey(grp,m), iVar3 == 0)) &&
     (iVar3 = mbedtls_ecp_check_pubkey(grp,P), iVar3 == 0)) {
    pmVar1 = (grp->G).X.p;
    if (pmVar1 == (mbedtls_mpi_uint *)0x0) {
      iVar3 = -0x4f80;
    }
    else {
      iVar3 = -0x4f80;
      if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
        mbedtls_mpi_init(&local_178.X);
        mbedtls_mpi_init(&local_178.Y);
        mbedtls_mpi_init(&local_178.Z);
        mbedtls_mpi_init(&local_48);
        iVar3 = mbedtls_mpi_copy(&local_48,&P->X);
        if (((iVar3 == 0) && (iVar3 = mbedtls_ecp_copy(&local_178,P), iVar3 == 0)) &&
           (iVar3 = mbedtls_mpi_lset(&R->X,1), iVar3 == 0)) {
          X = &R->Z;
          iVar3 = mbedtls_mpi_lset(X,0);
          if (iVar3 == 0) {
            mbedtls_mpi_free(&R->Y);
            Y = &grp->P;
            do {
              iVar3 = mbedtls_mpi_cmp_mpi(&local_178.X,Y);
              if (iVar3 < 0) {
                if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
                   (iVar3 = ecp_randomize_mxz(grp,&local_178,f_rng,p_rng), iVar3 == 0)) {
                  sVar4 = mbedtls_mpi_bitlen(m);
                  local_d0 = &grp->A;
                  goto LAB_001566a6;
                }
                break;
              }
              iVar3 = mbedtls_mpi_sub_abs(&local_178.X,&local_178.X,Y);
            } while (iVar3 == 0);
          }
        }
LAB_00156da2:
        mbedtls_mpi_free(&local_178.X);
        mbedtls_mpi_free(&local_178.Y);
        mbedtls_mpi_free(&local_178.Z);
        mbedtls_mpi_free(&local_48);
      }
      else if ((pmVar1 != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
        iVar3 = ecp_mul_comb(grp,R,m,P,f_rng,p_rng);
        return iVar3;
      }
    }
  }
  return iVar3;
LAB_001566a6:
  if (sVar4 == 0) {
    iVar3 = ecp_normalize_mxz(grp,R);
    goto LAB_00156da2;
  }
  local_c8 = sVar4 - 1;
  iVar3 = mbedtls_mpi_get_bit(m,sVar4 - 1);
  swap = (uchar)iVar3;
  iVar3 = mbedtls_mpi_safe_cond_swap(&R->X,&local_178.X,swap);
  if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_safe_cond_swap(X,&local_178.Z,swap), iVar3 != 0))
  goto LAB_00156da2;
  mbedtls_mpi_init(&local_60);
  mbedtls_mpi_init(&local_78);
  mbedtls_mpi_init(&local_118);
  mbedtls_mpi_init(&local_e8);
  mbedtls_mpi_init(&local_130);
  mbedtls_mpi_init(&local_90);
  mbedtls_mpi_init(&local_100);
  mbedtls_mpi_init(&local_a8);
  mbedtls_mpi_init(&local_c0);
  iVar3 = mbedtls_mpi_add_mpi(&local_60,&R->X,X);
  if (iVar3 == 0) {
    do {
      iVar3 = mbedtls_mpi_cmp_mpi(&local_60,Y);
      if (iVar3 < 0) {
        iVar3 = mbedtls_mpi_mul_mpi(&local_78,&local_60,&local_60);
        if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_78,grp), iVar3 == 0)) {
          mul_count = mul_count + 1;
          iVar3 = mbedtls_mpi_sub_mpi(&local_118,&R->X,X);
          goto joined_r0x001568d8;
        }
        break;
      }
      iVar3 = mbedtls_mpi_sub_abs(&local_60,&local_60,Y);
    } while (iVar3 == 0);
  }
LAB_001567dd:
  mbedtls_mpi_free(&local_60);
  mbedtls_mpi_free(&local_78);
  mbedtls_mpi_free(&local_118);
  mbedtls_mpi_free(&local_e8);
  mbedtls_mpi_free(&local_130);
  mbedtls_mpi_free(&local_90);
  mbedtls_mpi_free(&local_100);
  mbedtls_mpi_free(&local_a8);
  mbedtls_mpi_free(&local_c0);
  sVar4 = local_c8;
  if (((iVar3 != 0) || (iVar3 = mbedtls_mpi_safe_cond_swap(&R->X,&local_178.X,swap), iVar3 != 0)) ||
     (iVar3 = mbedtls_mpi_safe_cond_swap(X,&local_178.Z,swap), iVar3 != 0)) goto LAB_00156da2;
  goto LAB_001566a6;
joined_r0x001568d8:
  if (iVar3 != 0) goto LAB_001567dd;
  if ((-1 < local_118.s) || (iVar3 = mbedtls_mpi_cmp_int(&local_118,0), iVar3 == 0)) {
    iVar3 = mbedtls_mpi_mul_mpi(&local_e8,&local_118,&local_118);
    if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_e8,grp), iVar3 == 0)) {
      mul_count = mul_count + 1;
      iVar3 = mbedtls_mpi_sub_mpi(&local_130,&local_78,&local_e8);
      goto joined_r0x00156988;
    }
    goto LAB_001567dd;
  }
  iVar3 = mbedtls_mpi_add_mpi(&local_118,&local_118,Y);
  goto joined_r0x001568d8;
joined_r0x00156988:
  if (iVar3 != 0) goto LAB_001567dd;
  if ((-1 < local_130.s) || (iVar3 = mbedtls_mpi_cmp_int(&local_130,0), iVar3 == 0)) {
    iVar3 = mbedtls_mpi_add_mpi(&local_90,&local_178.X,&local_178.Z);
    goto joined_r0x001569e9;
  }
  iVar3 = mbedtls_mpi_add_mpi(&local_130,&local_130,Y);
  goto joined_r0x00156988;
joined_r0x001569e9:
  if (iVar3 != 0) goto LAB_001567dd;
  iVar3 = mbedtls_mpi_cmp_mpi(&local_90,Y);
  if (iVar3 < 0) {
    iVar3 = mbedtls_mpi_sub_mpi(&local_100,&local_178.X,&local_178.Z);
    goto joined_r0x00156a60;
  }
  iVar3 = mbedtls_mpi_sub_abs(&local_90,&local_90,Y);
  goto joined_r0x001569e9;
joined_r0x00156a60:
  if (iVar3 != 0) goto LAB_001567dd;
  if ((-1 < local_100.s) || (iVar3 = mbedtls_mpi_cmp_int(&local_100,0), iVar3 == 0)) {
    iVar3 = mbedtls_mpi_mul_mpi(&local_a8,&local_100,&local_60);
    if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_a8,grp), iVar3 == 0)) {
      mul_count = mul_count + 1;
      iVar3 = mbedtls_mpi_mul_mpi(&local_c0,&local_90,&local_118);
      if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_c0,grp), iVar3 == 0)) {
        mul_count = mul_count + 1;
        iVar3 = mbedtls_mpi_add_mpi(&local_178.X,&local_a8,&local_c0);
        if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_178.X,grp), iVar3 == 0)) {
          mul_count = mul_count + 1;
          iVar3 = mbedtls_mpi_mul_mpi(&local_178.X,&local_178.X,&local_178.X);
          if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_178.X,grp), iVar3 == 0)) {
            mul_count = mul_count + 1;
            iVar3 = mbedtls_mpi_sub_mpi(&local_178.Z,&local_a8,&local_c0);
            goto joined_r0x00156bc7;
          }
        }
      }
    }
    goto LAB_001567dd;
  }
  iVar3 = mbedtls_mpi_add_mpi(&local_100,&local_100,Y);
  goto joined_r0x00156a60;
joined_r0x00156bc7:
  if (iVar3 != 0) goto LAB_001567dd;
  if ((-1 < local_178.Z.s) || (iVar3 = mbedtls_mpi_cmp_int(&local_178.Z,0), iVar3 == 0)) {
    X_00 = &local_178.Z;
    iVar3 = mbedtls_mpi_mul_mpi(X_00,X_00,X_00);
    if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_178.Z,grp), iVar3 == 0)) {
      mul_count = mul_count + 1;
      iVar3 = mbedtls_mpi_mul_mpi(&local_178.Z,&local_48,&local_178.Z);
      if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_178.Z,grp), iVar3 == 0)) {
        mul_count = mul_count + 1;
        iVar3 = mbedtls_mpi_mul_mpi(&R->X,&local_78,&local_e8);
        if ((iVar3 == 0) && (iVar3 = ecp_modp(&R->X,grp), iVar3 == 0)) {
          mul_count = mul_count + 1;
          iVar3 = mbedtls_mpi_mul_mpi(X,local_d0,&local_130);
          if ((iVar3 == 0) && (iVar3 = ecp_modp(X,grp), iVar3 == 0)) {
            mul_count = mul_count + 1;
            iVar3 = mbedtls_mpi_add_mpi(X,&local_e8,X);
            goto joined_r0x00156d10;
          }
        }
      }
    }
    goto LAB_001567dd;
  }
  iVar3 = mbedtls_mpi_add_mpi(&local_178.Z,&local_178.Z,Y);
  goto joined_r0x00156bc7;
joined_r0x00156d10:
  if (iVar3 != 0) goto LAB_001567dd;
  iVar3 = mbedtls_mpi_cmp_mpi(X,Y);
  if (iVar3 < 0) {
    iVar3 = mbedtls_mpi_mul_mpi(X,&local_130,X);
    if ((iVar3 == 0) && (iVar3 = ecp_modp(X,grp), iVar3 == 0)) {
      mul_count = mul_count + 1;
      iVar3 = 0;
    }
    goto LAB_001567dd;
  }
  iVar3 = mbedtls_mpi_sub_abs(X,X,Y);
  goto joined_r0x00156d10;
}

Assistant:

int mbedtls_ecp_mul( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret;

    /* Common sanity checks */
    if( mbedtls_mpi_cmp_int( &P->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_check_privkey( grp, m ) ) != 0 ||
        ( ret = mbedtls_ecp_check_pubkey( grp, P ) ) != 0 )
        return( ret );

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
        return( ecp_mul_mxz( grp, R, m, P, f_rng, p_rng ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
        return( ecp_mul_comb( grp, R, m, P, f_rng, p_rng ) );
#endif
    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}